

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupLastPis(Gia_Man_t *p,int nLastPis)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x1f2,"Gia_Man_t *Gia_ManDupLastPis(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  iVar5 = 0;
  while ((iVar5 < p->vCis->nSize && (pGVar4 = Gia_ManCi(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
    uVar1 = 0xffffffff;
    if (p->vCis->nSize - nLastPis <= iVar5) {
      uVar1 = Gia_ManAppendCi(p_00);
    }
    pGVar4->Value = uVar1;
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while ((iVar5 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iLit1 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManAppendAnd(p_00,iVar2,iLit1);
      pGVar4->Value = uVar1;
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while( true ) {
    if (p->vCos->nSize <= iVar5) {
      return p_00;
    }
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    uVar1 = Gia_ManAppendCo(p_00,iVar2);
    pGVar4->Value = uVar1;
    iVar5 = iVar5 + 1;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupLastPis( Gia_Man_t * p, int nLastPis )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = (i < Gia_ManCiNum(p) - nLastPis) ? ~0 : Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    return pNew;
}